

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_moveable.hpp
# Opt level: O1

stack<int,_std::deque<int,_std::allocator<int>_>_> *
cpp_bindgen::any_cast<std::stack<int,std::deque<int,std::allocator<int>>>const>(any_moveable *src)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *psVar2;
  
  if (src == (any_moveable *)0x0) {
    return (stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x0;
  }
  iVar1 = (*((src->m_impl)._M_t.
             super___uniq_ptr_impl<cpp_bindgen::any_moveable::iface,_std::default_delete<cpp_bindgen::any_moveable::iface>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_bindgen::any_moveable::iface_*,_std::default_delete<cpp_bindgen::any_moveable::iface>_>
             .super__Head_base<0UL,_cpp_bindgen::any_moveable::iface_*,_false>._M_head_impl)->
            _vptr_iface[2])();
  __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 8);
  if (__s1 == "St5stackIiSt5dequeIiSaIiEEE") {
LAB_00109e27:
    psVar2 = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             ((src->m_impl)._M_t.
              super___uniq_ptr_impl<cpp_bindgen::any_moveable::iface,_std::default_delete<cpp_bindgen::any_moveable::iface>_>
              ._M_t.
              super__Tuple_impl<0UL,_cpp_bindgen::any_moveable::iface_*,_std::default_delete<cpp_bindgen::any_moveable::iface>_>
              .super__Head_base<0UL,_cpp_bindgen::any_moveable::iface_*,_false>._M_head_impl + 1);
  }
  else {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"St5stackIiSt5dequeIiSaIiEEE");
      if (iVar1 == 0) goto LAB_00109e27;
    }
    psVar2 = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x0;
  }
  return psVar2;
}

Assistant:

T *any_cast(any_moveable *src) noexcept {
            return src && src->type() == typeid(T) ? &static_cast<impl<T> *>(src->m_impl.get())->m_obj : nullptr;
        }